

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::AnyEq::operator()
          (AnyEq *this,basic_string_view<char,_std::char_traits<char>_> *a,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b)

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  __y._M_str = (b->_M_dataplus)._M_p;
  __y._M_len = b->_M_string_length;
  bVar1 = std::operator==(*a,__y);
  return bVar1;
}

Assistant:

bool operator()(const A& a, const B& b) const {
    return a == b;
  }